

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoll.c
# Opt level: O1

int ffpcnl(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,char *array
          ,char nulvalue,int *status)

{
  long lVar1;
  tcolumn *ptVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  LONGLONG nelempar;
  long lVar8;
  bool bVar9;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3))
    goto LAB_0019e050;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  ptVar2 = fptr->Fptr->tableptr;
  if (ptVar2[(long)colnum + -1].tdatatype < 1) {
    lVar4 = nelem + firstelem + -1;
  }
  else {
    lVar4 = ptVar2[(long)colnum + -1].trepeat;
  }
  iVar3 = ffpcll(fptr,colnum,firstrow,firstelem,nelem,array,status);
  if (iVar3 < 1) {
    lVar6 = (firstrow + -1) * lVar4;
    lVar1 = lVar6 + firstelem;
    if (nelem < 1) {
      bVar9 = false;
      nelempar = 0;
      nelem = 0;
    }
    else {
      lVar7 = 0;
      nelempar = 0;
      lVar8 = 0;
      do {
        if (array[lVar7] == nulvalue) {
          nelempar = nelempar + 1;
          lVar8 = 0;
        }
        else {
          if ((nelempar != 0) &&
             (lVar5 = ((lVar6 + firstelem + -1 + lVar7) - nelempar) / lVar4,
             iVar3 = ffpclu(fptr,colnum,lVar5 + 1,((lVar1 + lVar7) - nelempar) + -lVar4 * lVar5,
                            nelempar,status), 0 < iVar3)) goto LAB_0019e050;
          lVar8 = lVar8 + 1;
          nelempar = 0;
        }
        lVar7 = lVar7 + 1;
      } while (nelem != lVar7);
      bVar9 = lVar8 != 0;
    }
    if (nelempar != 0 && !bVar9) {
      lVar6 = (lVar1 + (nelem - nelempar) + -1) / lVar4;
      ffpclu(fptr,colnum,lVar6 + 1,((nelem - nelempar) + lVar1) - lVar6 * lVar4,nelempar,status);
    }
  }
LAB_0019e050:
  return *status;
}

Assistant:

int ffpcnl( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            char  *array,    /* I - array of values to write                */
            char  nulvalue,  /* I - array flagging undefined pixels if true */
            int  *status)    /* IO - error status                           */
/*
  Write an array of elements to the specified column of a table.  Any input
  pixels flagged as null will be replaced by the appropriate
  null value in the output FITS file. 
*/
{
    tcolumn *colptr;
    LONGLONG  ngood = 0, nbad = 0, ii;
    LONGLONG repeat, first, fstelm, fstrow;
    int tcode;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode  = colptr->tdatatype;

    if (tcode > 0)
       repeat = colptr->trepeat;  /* repeat count for this column */
    else
       repeat = firstelem -1 + nelem;  /* variable length arrays */

    /* first write the whole input vector, then go back and fill in the nulls */
    if (ffpcll(fptr, colnum, firstrow, firstelem, nelem, array, status) > 0)
          return(*status);

    /* absolute element number in the column */
    first = (firstrow - 1) * repeat + firstelem;

    for (ii = 0; ii < nelem; ii++)
    {
      if (array[ii] != nulvalue)  /* is this a good pixel? */
      {
         if (nbad)  /* write previous string of bad pixels */
         {
            fstelm = ii - nbad + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (ffpclu(fptr, colnum, fstrow, fstelm, nbad, status) > 0)
                return(*status);

            nbad=0;
         }

         ngood = ngood +1;  /* the consecutive number of good pixels */
      }
      else
      {
         if (ngood)  /* write previous string of good pixels */
         {
            fstelm = ii - ngood + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

/*  good values have already been written
            if (ffpcll(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood],
                status) > 0)
                return(*status);
*/
            ngood=0;
         }

         nbad = nbad +1;  /* the consecutive number of bad pixels */
      }
    }

    /* finished loop;  now just write the last set of pixels */

    if (ngood)  /* write last string of good pixels */
    {
      fstelm = ii - ngood + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

/*  these have already been written
      ffpcll(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood], status);
*/
    }
    else if (nbad) /* write last string of bad pixels */
    {
      fstelm = ii - nbad + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      ffpclu(fptr, colnum, fstrow, fstelm, nbad, status);
    }

    return(*status);
}